

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall Catch::Matchers::IsNaNMatcher::~IsNaNMatcher(IsNaNMatcher *this)

{
  IsNaNMatcher *this_local;
  
  ~IsNaNMatcher(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

IsNaNMatcher() = default;